

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int fits_img_stats_short
              (short *array,long nx,long ny,int nullcheck,short nullvalue,long *ngoodpix,
              short *minvalue,short *maxvalue,double *mean,double *sigma,double *noise1,
              double *noise2,double *noise3,double *noise5,int *status)

{
  double local_88;
  double xnoise5;
  double xnoise3;
  double xnoise2;
  double xnoise;
  double xsigma;
  double xmean;
  short maxval;
  long lStack_50;
  short minval;
  long ngood;
  long *ngoodpix_local;
  short nullvalue_local;
  long lStack_38;
  int nullcheck_local;
  long ny_local;
  long nx_local;
  short *array_local;
  
  xmean._6_2_ = 0;
  xmean._4_2_ = 0;
  xsigma = 0.0;
  xnoise = 0.0;
  xnoise2 = 0.0;
  xnoise3 = 0.0;
  xnoise5 = 0.0;
  local_88 = 0.0;
  ngood = (long)ngoodpix;
  ngoodpix_local._2_2_ = nullvalue;
  ngoodpix_local._4_4_ = nullcheck;
  lStack_38 = ny;
  ny_local = nx;
  nx_local = (long)array;
  if ((mean != (double *)0x0) || (sigma != (double *)0x0)) {
    FnMeanSigma_short(array,nx * ny,nullcheck,nullvalue,&stack0xffffffffffffffb0,&xsigma,&xnoise,
                      status);
    if (ngood != 0) {
      *(long *)ngood = lStack_50;
    }
    if (mean != (double *)0x0) {
      *mean = xsigma;
    }
    if (sigma != (double *)0x0) {
      *sigma = xnoise;
    }
  }
  if (noise1 != (double *)0x0) {
    FnNoise1_short((short *)nx_local,ny_local,lStack_38,ngoodpix_local._4_4_,ngoodpix_local._2_2_,
                   &xnoise2,status);
    *noise1 = xnoise2;
  }
  if (((minvalue != (short *)0x0) || (maxvalue != (short *)0x0)) || (noise3 != (double *)0x0)) {
    FnNoise5_short((short *)nx_local,ny_local,lStack_38,ngoodpix_local._4_4_,ngoodpix_local._2_2_,
                   &stack0xffffffffffffffb0,(short *)((long)&xmean + 6),(short *)((long)&xmean + 4),
                   &xnoise3,&xnoise5,&local_88,status);
    if (ngood != 0) {
      *(long *)ngood = lStack_50;
    }
    if (minvalue != (short *)0x0) {
      *minvalue = xmean._6_2_;
    }
    if (maxvalue != (short *)0x0) {
      *maxvalue = xmean._4_2_;
    }
    if (noise2 != (double *)0x0) {
      *noise2 = xnoise3;
    }
    if (noise3 != (double *)0x0) {
      *noise3 = xnoise5;
    }
    if (noise5 != (double *)0x0) {
      *noise5 = local_88;
    }
  }
  return *status;
}

Assistant:

int fits_img_stats_short(short *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	short nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	short *minvalue,    /* returned minimum non-null value in the array */
	short *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input short integer image.
*/
{
	long ngood;
	short minval = 0, maxval = 0;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_short(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_short(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_short(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}